

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_buffer.hpp
# Opt level: O0

void __thiscall CircularBuffer<cv::Mat_*>::setMaxSize(CircularBuffer<cv::Mat_*> *this,uint new_size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Mat **ppMVar3;
  uint local_18;
  uint i;
  uint new_size_local;
  CircularBuffer<cv::Mat_*> *this_local;
  
  if (this->data != (Mat **)0x0) {
    operator_delete__(this->data);
  }
  this->count_of_elements = 0;
  this->first_element_index = 0;
  this->last_element_index = 0;
  this->count_of_slots = new_size;
  if (this->count_of_slots == 0) {
    this->data = (Mat **)0x0;
  }
  else {
    auVar1 = ZEXT416(this->count_of_slots) * ZEXT816(8);
    uVar2 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    ppMVar3 = (Mat **)operator_new__(uVar2);
    this->data = ppMVar3;
    for (local_18 = 0; local_18 < this->count_of_slots; local_18 = local_18 + 1) {
      this->data[local_18] = (Mat *)0x0;
    }
  }
  return;
}

Assistant:

void CircularBuffer<T *>::setMaxSize(unsigned int new_size)
{
    delete[] data;
    count_of_elements = 0;
    first_element_index = 0; //initial value is not important, these values are always set when elements are
    last_element_index = 0; //added or removed to/from buffer
    //we assume here that count_of_slots is bigger than 0
    count_of_slots = new_size;
    if(count_of_slots > 0) {
        data = new T *[count_of_slots];
        for(unsigned int i = 0; i < count_of_slots; i++) {
            data[i] = nullptr;
        }
    } else {
        data = nullptr;
    }
}